

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupMenuFile(CEditor *this,void *pContext,CUIRect View)

{
  int iVar1;
  undefined8 uVar2;
  char *pTitle;
  bool bVar3;
  char *pButtonText;
  long in_FS_OFFSET;
  CUIRect Slot;
  code *pfnFunc;
  CUIRect local_48;
  CUIRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = View;
  CUIRect::HSplitTop(&local_38,2.0,&local_48,&local_38);
  CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
  iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_NewMapButton,"New",0,&local_48,0,
                            "Creates a new map");
  if (iVar1 == 0) {
    CUIRect::HSplitTop(&local_38,10.0,&local_48,&local_38);
    CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
    iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_OpenButton,"Load",0,&local_48,0,
                              "Opens a map for editing");
    if (iVar1 == 0) {
      if (this->m_pClient->m_State == 3) {
        CUIRect::HSplitTop(&local_38,2.0,&local_48,&local_38);
        CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
        iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_OpenCurrentButton,"Load Current Map",0,
                                  &local_48,0,"Opens the current in game map for editing");
        if (iVar1 != 0) {
          iVar1 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
          if ((char)iVar1 == '\0') {
            LoadCurrentMap(this);
            goto LAB_001ac280;
          }
          uVar2 = 0x100000002;
          goto LAB_001ac0f8;
        }
      }
      CUIRect::HSplitTop(&local_38,10.0,&local_48,&local_38);
      CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
      iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_AppendButton,"Append",0,&local_48,0,
                                "Opens a map and adds everything from that map to the current one");
      if (iVar1 != 0) {
        pfnFunc = CallbackAppendMap;
        pTitle = "Append map";
        pButtonText = "Append";
        goto LAB_001ac26a;
      }
      CUIRect::HSplitTop(&local_38,10.0,&local_48,&local_38);
      CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
      iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_SaveButton,"Save",0,&local_48,0,
                                "Saves the current map");
      if (iVar1 == 0) {
        CUIRect::HSplitTop(&local_38,2.0,&local_48,&local_38);
        CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
        iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_SaveAsButton,"Save As",0,&local_48,0,
                                  "Saves the current map under a new name");
        if (iVar1 != 0) goto LAB_001ac3b8;
        CUIRect::HSplitTop(&local_38,10.0,&local_48,&local_38);
        CUIRect::HSplitTop(&local_38,12.0,&local_48,&local_38);
        bVar3 = false;
        iVar1 = DoButton_MenuItem(this,&PopupMenuFile::s_ExitButton,"Exit",0,&local_48,0,
                                  "Exits from the editor");
        if (iVar1 == 0) goto LAB_001ac283;
        iVar1 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
        if ((char)iVar1 == '\0') {
          this->m_pConfig->m_ClEditor = 0;
          goto LAB_001ac280;
        }
        uVar2 = 0x100000000;
LAB_001ac0f8:
        this->m_PopupEventType = (int)uVar2;
        this->m_PopupEventActivated = (int)((ulong)uVar2 >> 0x20);
        goto LAB_001ac280;
      }
      if ((this->m_aFileName[0] != '\0') && (this->m_ValidSaveFilename == true)) {
        str_copy(this->m_aFileSaveName,this->m_aFileName,0x200);
        uVar2 = 0x100000004;
        goto LAB_001ac0f8;
      }
LAB_001ac3b8:
      pfnFunc = CallbackSaveMap;
      pTitle = "Save map";
      pButtonText = "Save";
      iVar1 = 0;
    }
    else {
      iVar1 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
      if ((char)iVar1 != '\0') {
        uVar2 = 0x100000001;
        goto LAB_001ac0f8;
      }
      pfnFunc = CallbackOpenMap;
      pTitle = "Load map";
      pButtonText = "Load";
LAB_001ac26a:
      iVar1 = -1;
    }
    InvokeFileDialog(this,iVar1,0,pTitle,pButtonText,"maps","",pfnFunc,this);
  }
  else {
    iVar1 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
    if ((char)iVar1 != '\0') {
      uVar2 = 0x100000003;
      goto LAB_001ac0f8;
    }
    Reset(this,true);
    this->m_aFileName[0] = '\0';
  }
LAB_001ac280:
  bVar3 = true;
LAB_001ac283:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupMenuFile(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	static int s_NewMapButton = 0;
	static int s_SaveButton = 0;
	static int s_SaveAsButton = 0;
	static int s_OpenButton = 0;
	static int s_OpenCurrentButton = 0;
	static int s_AppendButton = 0;
	static int s_ExitButton = 0;

	CUIRect Slot;
	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_NewMapButton, "New", 0, &Slot, 0, "Creates a new map"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_NEW;
			pEditor->m_PopupEventActivated = true;
		}
		else
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_OpenButton, "Load", 0, &Slot, 0, "Opens a map for editing"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_LOAD;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		return true;
	}

	if(pEditor->Client()->State() == IClient::STATE_ONLINE)
	{
		View.HSplitTop(2.0f, &Slot, &View);
		View.HSplitTop(12.0f, &Slot, &View);
		if(pEditor->DoButton_MenuItem(&s_OpenCurrentButton, "Load Current Map", 0, &Slot, 0, "Opens the current in game map for editing"))
		{
			if(pEditor->HasUnsavedData())
			{
				pEditor->m_PopupEventType = POPEVENT_LOAD_CURRENT;
				pEditor->m_PopupEventActivated = true;
			}
			else
				pEditor->LoadCurrentMap();
			return true;
		}
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_AppendButton, "Append", 0, &Slot, 0, "Opens a map and adds everything from that map to the current one"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Append map", "Append", "maps", "", pEditor->CallbackAppendMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveButton, "Save", 0, &Slot, 0, "Saves the current map"))
	{
		if(pEditor->m_aFileName[0] && pEditor->m_ValidSaveFilename)
		{
			str_copy(pEditor->m_aFileSaveName, pEditor->m_aFileName, sizeof(pEditor->m_aFileSaveName));
			pEditor->m_PopupEventType = POPEVENT_SAVE;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveAsButton, "Save As", 0, &Slot, 0, "Saves the current map under a new name"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_ExitButton, "Exit", 0, &Slot, 0, "Exits from the editor"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_EXIT;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->Config()->m_ClEditor = 0;
		return true;
	}

	return false;
}